

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O2

void * r2i_certpol(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *value)

{
  char *pcVar1;
  OPENSSL_STACK *sk;
  bool bVar2;
  bool bVar3;
  int iVar4;
  OPENSSL_STACK *sk_00;
  OPENSSL_STACK *sk_01;
  size_t sVar5;
  undefined8 *puVar6;
  OPENSSL_STACK *sk_02;
  POLICYINFO *a;
  OPENSSL_STACK *pOVar7;
  POLICYQUALINFO *pPVar8;
  ASN1_OBJECT *pAVar9;
  ASN1_IA5STRING *str;
  size_t sVar10;
  USERNOTICE *pUVar11;
  NOTICEREF *pNVar12;
  OPENSSL_STACK *sk_03;
  void *pvVar13;
  ASN1_INTEGER *a_00;
  ASN1_STRING *str_00;
  int iVar14;
  ulong i;
  ulong i_00;
  ulong i_01;
  ulong i_02;
  
  sk_00 = OPENSSL_sk_new_null();
  if (sk_00 != (OPENSSL_STACK *)0x0) {
    sk_01 = (OPENSSL_STACK *)X509V3_parse_list(value);
    if (sk_01 != (OPENSSL_STACK *)0x0) {
      i_00 = 0;
      bVar2 = false;
LAB_00201888:
      sVar5 = OPENSSL_sk_num(sk_01);
      if (sVar5 <= i_00) {
        sk_CONF_VALUE_pop_free((stack_st_CONF_VALUE *)sk_01,X509V3_conf_free);
        return sk_00;
      }
      puVar6 = (undefined8 *)OPENSSL_sk_value(sk_01,i_00);
      if ((puVar6[2] == 0) && (pcVar1 = (char *)puVar6[1], pcVar1 != (char *)0x0)) {
        iVar4 = strcmp(pcVar1,"ia5org");
        bVar3 = true;
        if (iVar4 == 0) {
LAB_00201d0c:
          bVar2 = bVar3;
          i_00 = i_00 + 1;
          goto LAB_00201888;
        }
        if (*pcVar1 != '@') {
          pAVar9 = OBJ_txt2obj(pcVar1,0);
          if (pAVar9 == (ASN1_OBJECT *)0x0) {
            iVar4 = 0x81;
            iVar14 = 0x9b;
            goto LAB_00201d66;
          }
          a = POLICYINFO_new();
          if (a != (POLICYINFO *)0x0) {
            a->policyid = pAVar9;
LAB_00201cf4:
            sVar5 = OPENSSL_sk_push(sk_00,a);
            bVar3 = bVar2;
            if (sVar5 == 0) goto LAB_00201de7;
            goto LAB_00201d0c;
          }
          ASN1_OBJECT_free(pAVar9);
          goto LAB_00201dec;
        }
        sk_02 = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,pcVar1 + 1);
        if (sk_02 != (OPENSSL_STACK *)0x0) {
          a = POLICYINFO_new();
          if (a != (POLICYINFO *)0x0) {
            for (i = 0; sVar5 = OPENSSL_sk_num(sk_02), i < sVar5; i = i + 1) {
              puVar6 = (undefined8 *)OPENSSL_sk_value(sk_02,i);
              pcVar1 = (char *)puVar6[1];
              iVar4 = strcmp(pcVar1,"policyIdentifier");
              if (iVar4 == 0) {
                pAVar9 = OBJ_txt2obj((char *)puVar6[2],0);
                if (pAVar9 == (ASN1_OBJECT *)0x0) {
                  iVar4 = 0x81;
                  iVar14 = 0xc2;
                  goto LAB_00201f9d;
                }
                a->policyid = pAVar9;
              }
              else {
                iVar4 = x509v3_conf_name_matches(pcVar1,"CPS");
                if (iVar4 == 0) {
                  iVar4 = x509v3_conf_name_matches((char *)puVar6[1],"userNotice");
                  if (iVar4 == 0) {
                    iVar4 = 0x82;
                    iVar14 = 0xf6;
                  }
                  else if (*(char *)puVar6[2] == '@') {
                    pOVar7 = (OPENSSL_STACK *)
                             X509V3_get_section((X509V3_CTX *)ctx,(char *)puVar6[2] + 1);
                    if (pOVar7 != (OPENSSL_STACK *)0x0) {
                      pPVar8 = POLICYQUALINFO_new();
                      if (pPVar8 != (POLICYQUALINFO *)0x0) {
                        pAVar9 = OBJ_nid2obj(0xa5);
                        pPVar8->pqualid = pAVar9;
                        if (pAVar9 == (ASN1_OBJECT *)0x0) {
                          iVar4 = 0x44;
                          iVar14 = 0x112;
                        }
                        else {
                          pUVar11 = USERNOTICE_new();
                          if (pUVar11 == (USERNOTICE *)0x0) goto LAB_00201dd3;
                          (pPVar8->d).usernotice = pUVar11;
                          for (i_02 = 0; sVar5 = OPENSSL_sk_num(pOVar7), i_02 < sVar5;
                              i_02 = i_02 + 1) {
                            puVar6 = (undefined8 *)OPENSSL_sk_value(pOVar7,i_02);
                            pcVar1 = (char *)puVar6[1];
                            iVar4 = strcmp(pcVar1,"explicitText");
                            if (iVar4 == 0) {
                              str_00 = ASN1_VISIBLESTRING_new();
                              pUVar11->exptext = str_00;
                              if (str_00 == (ASN1_VISIBLESTRING *)0x0) goto LAB_00201dd3;
LAB_00201c31:
                              pcVar1 = (char *)puVar6[2];
                              sVar10 = strlen(pcVar1);
                              iVar4 = ASN1_STRING_set(str_00,pcVar1,(int)sVar10);
                              if (iVar4 == 0) goto LAB_00201dd3;
                            }
                            else {
                              iVar4 = strcmp(pcVar1,"organization");
                              if (iVar4 == 0) {
                                pNVar12 = pUVar11->noticeref;
                                if (pNVar12 == (NOTICEREF *)0x0) {
                                  pNVar12 = NOTICEREF_new();
                                  if (pNVar12 == (NOTICEREF *)0x0) goto LAB_00201dd3;
                                  pUVar11->noticeref = pNVar12;
                                }
                                str_00 = pNVar12->organization;
                                str_00->type = (uint)!bVar2 * 4 + 0x16;
                                goto LAB_00201c31;
                              }
                              iVar4 = strcmp(pcVar1,"noticeNumbers");
                              if (iVar4 != 0) {
                                ERR_put_error(0x14,0,0x82,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                              ,0x14e);
                                ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],",value:"
                                                   ,puVar6[2]);
                                goto LAB_00201dd3;
                              }
                              pNVar12 = pUVar11->noticeref;
                              if (pNVar12 == (NOTICEREF *)0x0) {
                                pNVar12 = NOTICEREF_new();
                                if (pNVar12 == (NOTICEREF *)0x0) goto LAB_00201dd3;
                                pUVar11->noticeref = pNVar12;
                              }
                              sk_03 = (OPENSSL_STACK *)X509V3_parse_list((char *)puVar6[2]);
                              if ((sk_03 == (OPENSSL_STACK *)0x0) ||
                                 (sVar5 = OPENSSL_sk_num(sk_03), sVar5 == 0)) {
                                ERR_put_error(0x14,0,0x80,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                              ,0x143);
                                ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],",value:"
                                                   ,puVar6[2]);
LAB_00201dbf:
                                sk_CONF_VALUE_pop_free
                                          ((stack_st_CONF_VALUE *)sk_03,X509V3_conf_free);
                                goto LAB_00201dd3;
                              }
                              sk = (OPENSSL_STACK *)pNVar12->noticenos;
                              i_01 = 0;
                              while (sVar5 = OPENSSL_sk_num(sk_03), i_01 < sVar5) {
                                pvVar13 = OPENSSL_sk_value(sk_03,i_01);
                                a_00 = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,
                                                        *(char **)((long)pvVar13 + 8));
                                if (a_00 == (ASN1_INTEGER *)0x0) {
                                  ERR_put_error(0x14,0,0x7f,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                                ,0x167);
                                  goto LAB_00201dbf;
                                }
                                sVar5 = OPENSSL_sk_push(sk,a_00);
                                i_01 = i_01 + 1;
                                if (sVar5 == 0) {
                                  ASN1_INTEGER_free(a_00);
                                  goto LAB_00201dbf;
                                }
                              }
                              sk_CONF_VALUE_pop_free((stack_st_CONF_VALUE *)sk_03,X509V3_conf_free);
                            }
                          }
                          pNVar12 = pUVar11->noticeref;
                          if ((pNVar12 == (NOTICEREF *)0x0) ||
                             ((pNVar12->noticenos != (stack_st_ASN1_INTEGER *)0x0 &&
                              (pNVar12->organization != (ASN1_STRING *)0x0)))) {
                            pOVar7 = (OPENSSL_STACK *)a->qualifiers;
                            if (pOVar7 == (OPENSSL_STACK *)0x0) {
                              pOVar7 = OPENSSL_sk_new_null();
                              a->qualifiers = (stack_st_POLICYQUALINFO *)pOVar7;
                            }
                            sVar5 = OPENSSL_sk_push(pOVar7,pPVar8);
                            if (sVar5 != 0) goto LAB_00201a39;
                            goto LAB_00201de7;
                          }
                          iVar4 = 0x8a;
                          iVar14 = 0x156;
                        }
                        ERR_put_error(0x14,0,iVar4,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                      ,iVar14);
                      }
LAB_00201dd3:
                      POLICYQUALINFO_free(pPVar8);
                      goto LAB_00201de7;
                    }
                    iVar4 = 0x86;
                    iVar14 = 0xe7;
                  }
                  else {
                    iVar4 = 0x6f;
                    iVar14 = 0xe0;
                  }
LAB_00201f9d:
                  ERR_put_error(0x14,0,iVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                                ,iVar14);
                  ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],",value:",puVar6[2]);
                  goto LAB_00201de7;
                }
                if (a->qualifiers == (stack_st_POLICYQUALINFO *)0x0) {
                  pOVar7 = OPENSSL_sk_new_null();
                  a->qualifiers = (stack_st_POLICYQUALINFO *)pOVar7;
                }
                pPVar8 = POLICYQUALINFO_new();
                if ((pPVar8 == (POLICYQUALINFO *)0x0) ||
                   (sVar5 = OPENSSL_sk_push((OPENSSL_STACK *)a->qualifiers,pPVar8), sVar5 == 0))
                goto LAB_00201de7;
                pAVar9 = OBJ_nid2obj(0xa4);
                pPVar8->pqualid = pAVar9;
                if (pAVar9 == (ASN1_OBJECT *)0x0) {
                  iVar4 = 0x44;
                  iVar14 = 0xd4;
                  goto LAB_00201eb0;
                }
                str = ASN1_IA5STRING_new();
                (pPVar8->d).cpsuri = str;
                if (str == (ASN1_IA5STRING *)0x0) goto LAB_00201de7;
                pcVar1 = (char *)puVar6[2];
                sVar10 = strlen(pcVar1);
                iVar4 = ASN1_STRING_set(str,pcVar1,(int)sVar10);
                if (iVar4 == 0) goto LAB_00201de7;
              }
LAB_00201a39:
            }
            if (a->policyid != (ASN1_OBJECT *)0x0) goto LAB_00201cf4;
            iVar4 = 0x8e;
            iVar14 = 0xfd;
LAB_00201eb0:
            ERR_put_error(0x14,0,iVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                          ,iVar14);
          }
LAB_00201de7:
          POLICYINFO_free(a);
          goto LAB_00201dec;
        }
        iVar4 = 0x86;
        iVar14 = 0x8f;
      }
      else {
        iVar4 = 0x83;
        iVar14 = 0x83;
      }
LAB_00201d66:
      ERR_put_error(0x14,0,iVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                    ,iVar14);
      ERR_add_error_data(6,"section:",*puVar6,",name:",puVar6[1],",value:",puVar6[2]);
      goto LAB_00201dec;
    }
    ERR_put_error(0x14,0,0x14,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                  ,0x7c);
LAB_00201dec:
    sk_CONF_VALUE_pop_free((stack_st_CONF_VALUE *)sk_01,X509V3_conf_free);
    sk_POLICYINFO_pop_free((stack_st_POLICYINFO *)sk_00,POLICYINFO_free);
  }
  return (void *)0x0;
}

Assistant:

static void *r2i_certpol(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                         const char *value) {
  STACK_OF(POLICYINFO) *pols = sk_POLICYINFO_new_null();
  if (pols == NULL) {
    return NULL;
  }
  STACK_OF(CONF_VALUE) *vals = X509V3_parse_list(value);

  {
    if (vals == NULL) {
      OPENSSL_PUT_ERROR(X509V3, ERR_R_X509V3_LIB);
      goto err;
    }
    int ia5org = 0;
    for (size_t i = 0; i < sk_CONF_VALUE_num(vals); i++) {
      const CONF_VALUE *cnf = sk_CONF_VALUE_value(vals, i);
      if (cnf->value || !cnf->name) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_POLICY_IDENTIFIER);
        X509V3_conf_err(cnf);
        goto err;
      }
      POLICYINFO *pol;
      const char *pstr = cnf->name;
      if (!strcmp(pstr, "ia5org")) {
        ia5org = 1;
        continue;
      } else if (*pstr == '@') {
        const STACK_OF(CONF_VALUE) *polsect = X509V3_get_section(ctx, pstr + 1);
        if (!polsect) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SECTION);

          X509V3_conf_err(cnf);
          goto err;
        }
        pol = policy_section(ctx, polsect, ia5org);
        if (!pol) {
          goto err;
        }
      } else {
        ASN1_OBJECT *pobj = OBJ_txt2obj(cnf->name, 0);
        if (pobj == NULL) {
          OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
          X509V3_conf_err(cnf);
          goto err;
        }
        pol = POLICYINFO_new();
        if (pol == NULL) {
          ASN1_OBJECT_free(pobj);
          goto err;
        }
        pol->policyid = pobj;
      }
      if (!sk_POLICYINFO_push(pols, pol)) {
        POLICYINFO_free(pol);
        goto err;
      }
    }
    sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
    return pols;
  }

err:
  sk_CONF_VALUE_pop_free(vals, X509V3_conf_free);
  sk_POLICYINFO_pop_free(pols, POLICYINFO_free);
  return NULL;
}